

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

void __thiscall
Js::HeapArgumentsObject::HeapArgumentsObject
          (HeapArgumentsObject *this,Recycler *recycler,ActivationObject *obj,uint32 formalCount,
          DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *in_RAX;
  undefined4 *puVar3;
  WriteBarrierPtr<Js::ActivationObject> local_28;
  
  local_28.ptr = (ActivationObject *)in_RAX;
  ArgumentsObject::ArgumentsObject(&this->super_ArgumentsObject,type);
  (this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013881a8;
  *(undefined4 *)&this->field_0x20 = 0;
  this->formalCount = formalCount;
  Memory::WriteBarrierPtr<Js::ActivationObject>::WriteBarrierSet(&this->frameObject,obj);
  (this->deletedArgs).ptr = (BVSparse<Memory::Recycler> *)0x0;
  if ((this->frameObject).ptr != (ActivationObject *)0x0) {
    Memory::WriteBarrierPtr<Js::ActivationObject>::WriteBarrierPtr(&local_28,&this->frameObject);
    bVar2 = VarIsImpl<Js::ActivationObject>((RecyclableObject *)local_28.ptr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                  ,0x26,"(!frameObject || VarIsCorrectType(frameObject))",
                                  "!frameObject || VarIsCorrectType(frameObject)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

HeapArgumentsObject::HeapArgumentsObject(Recycler *recycler, ActivationObject* obj, uint32 formalCount, DynamicType * type)
        : ArgumentsObject(type), frameObject(obj), formalCount(formalCount), numOfArguments(0), callerDeleted(false), deletedArgs(nullptr)
    {
        Assert(!frameObject || VarIsCorrectType(frameObject));
    }